

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

void ffrprt(FILE *stream,int status)

{
  int iVar1;
  char status_str [31];
  char errmsg [81];
  char acStack_98 [32];
  char local_78 [88];
  
  if (status != 0) {
    ffgerr(status,acStack_98);
    fprintf((FILE *)stream,"\nFITSIO status = %d: %s\n",status,acStack_98);
    iVar1 = ffgmsg(local_78);
    if (iVar1 != 0) {
      do {
        fprintf((FILE *)stream,"%s\n",local_78);
        iVar1 = ffgmsg(local_78);
      } while (iVar1 != 0);
    }
  }
  return;
}

Assistant:

void ffrprt( FILE *stream, int status)
/* 
   Print out report of cfitsio error status and messages on the error stack.
   Uses C FILE stream.
*/
{
    char status_str[FLEN_STATUS], errmsg[FLEN_ERRMSG];
  
    if (status)
    {

      fits_get_errstatus(status, status_str);  /* get the error description */
      fprintf(stream, "\nFITSIO status = %d: %s\n", status, status_str);

      while ( fits_read_errmsg(errmsg) )  /* get error stack messages */
             fprintf(stream, "%s\n", errmsg);
    }
    return; 
}